

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O2

ostream * operator<<(ostream *out,Vector *w)

{
  ostream *poVar1;
  
  std::operator<<(out,"[");
  poVar1 = std::ostream::_M_insert<double>(w->x);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>(w->y);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>(w->z);
  std::operator<<(poVar1,"]");
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Vector& w) {
      out << "[" << w.x << ", " << w.y << ", " << w.z << "]";
      return out;
   }